

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolver.hpp
# Opt level: O0

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::SPxSolverBase(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this,Type p_type,Representation p_rep,TYPE ttype)

{
  Timer *pTVar1;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  Timer *pTVar2;
  undefined4 in_ECX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  undefined8 *in_RDI;
  double dVar3;
  nullptr_t in_stack_fffffffffffffbd8;
  uint32_t randomseed;
  cpp_dec_float<200U,_int,_void> *in_stack_fffffffffffffbe0;
  double in_stack_fffffffffffffbe8;
  Representation p_rep_00;
  cpp_dec_float<200U,_int,_void> *in_stack_fffffffffffffbf0;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffbf8;
  int n;
  DIdxSet *in_stack_fffffffffffffc00;
  shared_ptr<soplex::Tolerances> *in_stack_fffffffffffffc20;
  undefined8 in_stack_fffffffffffffc28;
  int p_dim;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffc30;
  undefined8 in_stack_fffffffffffffc48;
  TYPE TVar4;
  SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffc50;
  undefined8 local_2d0;
  undefined8 local_2c8;
  undefined8 local_2c0 [7];
  undefined8 local_288;
  undefined4 local_27c;
  undefined8 local_278;
  undefined8 local_270;
  undefined8 local_268;
  undefined8 local_260;
  undefined8 local_258;
  undefined1 local_24c [144];
  undefined4 local_1bc;
  undefined4 local_1b8;
  undefined4 local_1b4;
  undefined8 local_1a8;
  undefined8 local_1a0;
  undefined1 *local_198;
  undefined8 local_190;
  undefined8 local_188;
  undefined8 *local_180;
  undefined8 local_178;
  undefined8 *local_170;
  undefined8 *local_168;
  undefined8 local_160;
  undefined8 *local_158;
  long local_150;
  undefined8 local_148;
  undefined8 *local_140;
  undefined8 *local_138;
  undefined8 local_130;
  undefined8 *local_128;
  undefined8 *local_120;
  undefined8 local_118;
  undefined8 *local_110;
  undefined8 *local_108;
  undefined8 local_100;
  undefined8 *local_f8;
  long local_f0;
  undefined8 local_e8;
  undefined8 *local_e0;
  undefined8 *local_d8;
  undefined8 local_d0;
  undefined8 *local_c8;
  undefined8 *local_c0;
  undefined8 local_b8;
  undefined8 *local_b0;
  undefined8 *local_a8;
  undefined8 local_a0;
  undefined4 *local_98;
  undefined8 *local_90;
  undefined8 *local_88;
  long local_80;
  undefined8 *local_78;
  undefined8 *local_70;
  undefined8 *local_68;
  undefined4 *local_60;
  undefined8 *local_58;
  undefined8 *local_50;
  undefined8 *local_48;
  undefined8 *local_40;
  undefined8 *local_38;
  undefined8 *local_30;
  undefined8 *local_28;
  undefined8 *local_20;
  undefined8 *local_18;
  undefined8 local_10;
  undefined8 local_8;
  
  p_dim = (int)((ulong)in_stack_fffffffffffffc28 >> 0x20);
  TVar4 = (TYPE)((ulong)in_stack_fffffffffffffc48 >> 0x20);
  local_1bc = in_ECX;
  local_1b8 = in_EDX;
  local_1b4 = in_ESI;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SPxLPBase(in_stack_fffffffffffffbf8);
  n = (int)((ulong)in_stack_fffffffffffffbf8 >> 0x20);
  SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SPxBasisBase(in_stack_fffffffffffffc50,TVar4);
  *in_RDI = &PTR__SPxSolverBase_0089ee40;
  in_RDI[0x19] = &PTR__SPxSolverBase_0089f300;
  in_RDI[0x47] = &DAT_0089f320;
  *(undefined4 *)(in_RDI + 0xb5) = local_1b4;
  *(undefined4 *)((long)in_RDI + 0x5ac) = 0;
  *(undefined4 *)(in_RDI + 0xb6) = local_1b8;
  *(undefined4 *)((long)in_RDI + 0x5b4) = 0;
  in_RDI[0xb7] = 0;
  *(undefined4 *)(in_RDI + 0xb8) = local_1bc;
  in_RDI[0xb9] = 0;
  *(undefined4 *)(in_RDI + 0xba) = 0xffffffff;
  local_1a0 = infinity();
  local_198 = local_24c;
  local_1a8 = 0;
  local_8 = local_1a0;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            (in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0);
  dVar3 = boost::multiprecision::number::operator_cast_to_double
                    ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)0x6475b2);
  in_RDI[0xbb] = dVar3;
  *(undefined4 *)(in_RDI + 0xbc) = 0;
  in_RDI[0xbd] = 0;
  local_188 = infinity();
  local_190 = 0;
  local_180 = in_RDI + 0xbe;
  local_10 = local_188;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            (in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0);
  *(undefined1 *)(in_RDI + 0xce) = 1;
  *(undefined4 *)((long)in_RDI + 0x674) = 0;
  local_168 = in_RDI + 0xcf;
  local_258 = 0;
  local_170 = &local_258;
  local_178 = 0;
  local_18 = local_170;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            (in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0);
  *(undefined1 *)(in_RDI + 0xdf) = 0;
  local_150 = (long)in_RDI + 0x6fc;
  local_260 = 0;
  local_158 = &local_260;
  local_160 = 0;
  local_20 = local_158;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            (in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0);
  *(undefined1 *)((long)in_RDI + 0x77c) = 0;
  local_138 = in_RDI + 0xf0;
  local_268 = 0;
  local_140 = &local_268;
  local_148 = 0;
  local_28 = local_140;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            (in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0);
  *(undefined1 *)(in_RDI + 0x100) = 0;
  *(undefined4 *)((long)in_RDI + 0x804) = 0;
  local_120 = in_RDI + 0x101;
  local_270 = 0x3ff0000000000000;
  local_128 = &local_270;
  local_130 = 0;
  local_30 = local_128;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            (in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0);
  local_108 = in_RDI + 0x111;
  local_278 = 0x3ff0000000000000;
  local_110 = &local_278;
  local_118 = 0;
  local_38 = local_110;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            (in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0);
  local_90 = in_RDI + 0x121;
  local_27c = 0;
  local_98 = &local_27c;
  local_a0 = 0;
  local_60 = local_98;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
            (in_stack_fffffffffffffbf0,(longlong)in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0
            );
  local_88 = in_RDI + 0x131;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
            (in_stack_fffffffffffffbe0);
  *(undefined4 *)(in_RDI + 0x141) = 100;
  *(undefined4 *)((long)in_RDI + 0xa0c) = 0;
  *(undefined1 *)(in_RDI + 0x142) = 0;
  in_RDI[0x143] = 0;
  in_RDI[0x145] = 0;
  in_RDI[0x147] = 0;
  in_RDI[0x149] = 0;
  *(undefined1 *)(in_RDI + 0x14b) = 0;
  *(undefined1 *)((long)in_RDI + 0xa59) = 0;
  *(undefined1 *)((long)in_RDI + 0xa5a) = 0;
  local_80 = (long)in_RDI + 0xa64;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
            (in_stack_fffffffffffffbe0);
  SPxId::SPxId((SPxId *)0x6479e1);
  local_78 = in_RDI + 0x15e;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
            (in_stack_fffffffffffffbe0);
  *(undefined4 *)((long)in_RDI + 0xb74) = 0;
  *(undefined4 *)(in_RDI + 0x16f) = 200;
  local_f0 = (long)in_RDI + 0xb7c;
  local_288 = 0x3fe3333333333333;
  local_f8 = &local_288;
  local_100 = 0;
  local_40 = local_f8;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            (in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0);
  DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
  ::DataArray((DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
               *)in_stack_fffffffffffffbf0,(int)((ulong)in_stack_fffffffffffffbe8 >> 0x20),
              SUB84(in_stack_fffffffffffffbe8,0),(Real)in_stack_fffffffffffffbe0);
  DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
  ::DataArray((DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
               *)in_stack_fffffffffffffbf0,(int)((ulong)in_stack_fffffffffffffbe8 >> 0x20),
              SUB84(in_stack_fffffffffffffbe8,0),(Real)in_stack_fffffffffffffbe0);
  *(undefined1 *)(in_RDI + 0x187) = 0;
  *(undefined4 *)((long)in_RDI + 0xc3c) = 0;
  Array<soplex::UnitVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ::Array((Array<soplex::UnitVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           *)in_stack_fffffffffffffbf0,(int)((ulong)in_stack_fffffffffffffbe8 >> 0x20));
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)0x647b30);
  std::shared_ptr<soplex::Tolerances>::shared_ptr
            ((shared_ptr<soplex::Tolerances> *)in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::UpdateVector(in_stack_fffffffffffffc30,p_dim,in_stack_fffffffffffffc20);
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x647b93);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)0x647baf);
  std::shared_ptr<soplex::Tolerances>::shared_ptr
            ((shared_ptr<soplex::Tolerances> *)in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::UpdateVector(in_stack_fffffffffffffc30,p_dim,in_stack_fffffffffffffc20);
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x647c12);
  std::shared_ptr<soplex::Tolerances>::shared_ptr
            ((shared_ptr<soplex::Tolerances> *)in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
  randomseed = (uint32_t)((ulong)in_stack_fffffffffffffbd8 >> 0x20);
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::UpdateVector(in_stack_fffffffffffffc30,p_dim,in_stack_fffffffffffffc20);
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x647c73);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)0x647c8f);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)0x647cad);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)0x647ccb);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)0x647ce9);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)0x647d07);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)0x647d25);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)0x647d43);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)0x647d61);
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::DSVectorBase((DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)in_stack_fffffffffffffbf0,(int)((ulong)in_stack_fffffffffffffbe8 >> 0x20));
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::DSVectorBase((DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)in_stack_fffffffffffffbf0,(int)((ulong)in_stack_fffffffffffffbe8 >> 0x20));
  local_70 = in_RDI + 0x21a;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
            (in_stack_fffffffffffffbe0);
  local_68 = in_RDI + 0x22a;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
            (in_stack_fffffffffffffbe0);
  in_RDI[0x23a] = 0;
  in_RDI[0x23b] = 0;
  in_RDI[0x23c] = 0;
  local_d8 = in_RDI + 0x23d;
  local_2c0[0] = 0;
  local_e0 = local_2c0;
  local_e8 = 0;
  local_48 = local_e0;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            (in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0);
  local_c0 = in_RDI + 0x24d;
  local_2c8 = 0;
  local_c8 = &local_2c8;
  local_d0 = 0;
  local_50 = local_c8;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            (in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0);
  local_a8 = in_RDI + 0x25d;
  local_2d0 = 0;
  local_b0 = &local_2d0;
  local_b8 = 0;
  local_58 = local_b0;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            (in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0);
  Random::Random((Random *)in_stack_fffffffffffffbe0,randomseed);
  DIdxSet::DIdxSet(in_stack_fffffffffffffc00,n);
  DIdxSet::DIdxSet(in_stack_fffffffffffffc00,n);
  DIdxSet::DIdxSet(in_stack_fffffffffffffc00,n);
  DIdxSet::DIdxSet(in_stack_fffffffffffffc00,n);
  DataArray<int>::DataArray
            ((DataArray<int> *)in_stack_fffffffffffffbf0,
             (int)((ulong)in_stack_fffffffffffffbe8 >> 0x20),SUB84(in_stack_fffffffffffffbe8,0),
             (Real)in_stack_fffffffffffffbe0);
  DataArray<int>::DataArray
            ((DataArray<int> *)in_stack_fffffffffffffbf0,
             (int)((ulong)in_stack_fffffffffffffbe8 >> 0x20),SUB84(in_stack_fffffffffffffbe8,0),
             (Real)in_stack_fffffffffffffbe0);
  *(undefined1 *)(in_RDI + 0x286) = 0;
  *(undefined1 *)((long)in_RDI + 0x1431) = 0;
  *(undefined1 *)((long)in_RDI + 0x1432) = 0;
  *(undefined1 *)((long)in_RDI + 0x1433) = 1;
  *(undefined1 *)((long)in_RDI + 0x1434) = 1;
  *(undefined4 *)(in_RDI + 0x287) = 0;
  *(undefined4 *)((long)in_RDI + 0x143c) = 0;
  *(undefined4 *)(in_RDI + 0x288) = 0;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)in_stack_fffffffffffffbf0,(int)((ulong)in_stack_fffffffffffffbe8 >> 0x20));
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)in_stack_fffffffffffffbf0,(int)((ulong)in_stack_fffffffffffffbe8 >> 0x20));
  *(undefined1 *)(in_RDI + 0x28f) = 0;
  *(undefined4 *)(in_RDI + 0x294) = 0;
  *(undefined4 *)((long)in_RDI + 0x14a4) = 0;
  *(undefined4 *)(in_RDI + 0x295) = 0;
  *(undefined4 *)((long)in_RDI + 0x14ac) = 0;
  TVar4 = (TYPE)((ulong)(in_RDI + 0x297) >> 0x20);
  DataArray<int>::DataArray
            ((DataArray<int> *)in_stack_fffffffffffffbf0,
             (int)((ulong)in_stack_fffffffffffffbe8 >> 0x20),SUB84(in_stack_fffffffffffffbe8,0),
             (Real)in_stack_fffffffffffffbe0);
  pTVar1 = TimerFactory::createTimer(TVar4);
  in_RDI[0xb7] = pTVar1;
  this_00 = (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)TimerFactory::createTimer(TVar4);
  in_RDI[0x290] = this_00;
  pTVar1 = TimerFactory::createTimer(TVar4);
  in_RDI[0x291] = pTVar1;
  pTVar2 = TimerFactory::createTimer(TVar4);
  p_rep_00 = (Representation)((ulong)pTVar1 >> 0x20);
  in_RDI[0x292] = pTVar2;
  pTVar1 = TimerFactory::createTimer(TVar4);
  in_RDI[0x293] = pTVar1;
  in_RDI[0x48] = in_RDI;
  initRep(this_00,p_rep_00);
  return;
}

Assistant:

SPxSolverBase<R>::SPxSolverBase(
      Type            p_type,
      Representation  p_rep,
      Timer::TYPE     ttype)
      : theType(p_type)
      , thePricing(FULL)
      , theRep(p_rep)
      , polishObj(POLISH_OFF)
      , theTime(nullptr)
      , timerType(ttype)
      , theCumulativeTime(0.0)
      , maxIters(-1)
      , maxTime(R(infinity))
      , nClckSkipsLeft(0)
      , nCallsToTimelim(0)
      , objLimit(R(infinity))
      , useTerminationValue(true)
      , m_status(UNKNOWN)
      , m_nonbasicValue(0.0)
      , m_nonbasicValueUpToDate(false)
      , m_pricingViol(0.0)
      , m_pricingViolUpToDate(false)
      , m_pricingViolCo(0.0)
      , m_pricingViolCoUpToDate(false)
      , m_numViol(0)
      , entertolscale(1.0)
      , leavetolscale(1.0)
      , theShift(0)
      , m_maxCycle(100)
      , m_numCycle(0)
      , initialized(false)
      , solveVector2(nullptr)
      , solveVector3(nullptr)
      , coSolveVector2(nullptr)
      , coSolveVector3(nullptr)
      , freePricer(false)
      , freeRatioTester(false)
      , freeStarter(false)
      , displayLine(0)
      , displayFreq(200)
      , sparsePricingFactor(SOPLEX_SPARSITYFACTOR)
      , fullPerturbation(false)
      , printBasisMetric(0)
      , unitVecs(0)
      , primVec(0)
      , dualVec(0)
      , addVec(0)
      , thepricer(nullptr)
      , theratiotester(nullptr)
      , thestarter(nullptr)
      , boundrange(0.0)
      , siderange(0.0)
      , objrange(0.0)
      , infeasibilities(0)
      , infeasibilitiesCo(0)
      , isInfeasible(0)
      , isInfeasibleCo(0)
      , sparsePricingLeave(false)
      , sparsePricingEnter(false)
      , sparsePricingEnterCo(false)
      , hyperPricingLeave(true)
      , hyperPricingEnter(true)
      , remainingRoundsLeave(0)
      , remainingRoundsEnter(0)
      , remainingRoundsEnterCo(0)
      , weights(0)
      , coWeights(0)
      , weightsAreSetup(false)
      , multSparseCalls(0)
      , multFullCalls(0)
      , multColwiseCalls(0)
      , multUnsetupCalls(0)
      , integerVariables(0)
   {
      theTime = TimerFactory::createTimer(timerType);

      multTimeSparse = TimerFactory::createTimer(timerType);
      multTimeFull = TimerFactory::createTimer(timerType);
      multTimeColwise = TimerFactory::createTimer(timerType);
      multTimeUnsetup = TimerFactory::createTimer(timerType);

      this->theLP = this;
      initRep(p_rep);

      // info: SPxBasisBase is not consistent in this moment.
      //assert(SPxSolverBase<R>::isConsistent());
   }